

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O0

void lwsl_refcount_cx(lws_log_cx_t *cx,int _new)

{
  int _new_local;
  lws_log_cx_t *cx_local;
  
  if (cx != (lws_log_cx_t *)0x0) {
    if (_new < 1) {
      if (cx->refcount == 0) {
        __assert_fail("cx->refcount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/logs.c"
                      ,0x205,"void lwsl_refcount_cx(lws_log_cx_t *, int)");
      }
      cx->refcount = cx->refcount + -1;
    }
    else {
      cx->refcount = cx->refcount + 1;
    }
    if (cx->refcount_cb != (lws_log_use_cx_t)0x0) {
      (*cx->refcount_cb)(cx,_new);
    }
  }
  return;
}

Assistant:

void
lwsl_refcount_cx(lws_log_cx_t *cx, int _new)
{
	if (!cx)
		return;

	if (_new > 0)
		cx->refcount++;
	else {
		assert(cx->refcount);
		cx->refcount--;
	}

	if (cx->refcount_cb)
		cx->refcount_cb(cx, _new);
}